

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierParser::addRightParen(CQualifierParser *this)

{
  bool bVar1;
  allocator local_31;
  string local_30 [32];
  CQualifierParser *local_10;
  CQualifierParser *this_local;
  
  local_10 = this;
  bVar1 = CQualifierBuilder::IsNegative(&this->builder);
  if (bVar1) {
    CQualifierBuilder::AddNegative(&this->builder);
    this->afterRightParen = true;
  }
  else {
    bVar1 = CToken::IsNone(&this->namedQualifier);
    if (bVar1) {
      if ((this->afterRightParen & 1U) == 0) {
        CQualifierBuilder::AddNegative(&this->builder);
      }
      CParsingElementState::SetCorrect(&this->super_CParsingElementState);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30,"unexpected right parenthesis in named qualifier",&local_31);
      error(this,(string *)local_30);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
  }
  return;
}

Assistant:

void CQualifierParser::addRightParen()
{
	if( builder.IsNegative() ) {
		builder.AddNegative();
		afterRightParen = true;
	} else if( namedQualifier.IsNone() ) {
		if( !afterRightParen ) {
			builder.AddNegative();
		}
		SetCorrect();
	} else {
		error( "unexpected right parenthesis in named qualifier" );
	}
}